

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O1

bool __thiscall Kernel::RobSubstitution::unify(RobSubstitution *this,TermSpec s,TermSpec t)

{
  BacktrackData ***pppBVar1;
  BacktrackData **ppBVar2;
  BacktrackObject *pBVar3;
  BacktrackData **ppBVar4;
  BacktrackData BVar5;
  pair<Kernel::TermSpec,_Kernel::TermSpec> *ppVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  TermSpec *pTVar11;
  Entry *pEVar12;
  TermList TVar13;
  bool bVar14;
  VarSpec v;
  VarSpec v_00;
  TermSpec b;
  BacktrackData localBD;
  TermSpec dt2;
  TermSpec dt1;
  StlIter __begin6;
  pair<Kernel::TermSpec,_Kernel::TermSpec> x;
  BacktrackData local_1a0;
  TermSpec local_198;
  TermSpec local_188;
  undefined1 local_178 [16];
  TermList local_168;
  TermList TStack_160;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
  local_150;
  DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *local_120;
  Option<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_> local_118;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:120:59),_Kernel::TermSpec>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
  *local_e8;
  Option<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_> local_e0;
  TermList local_b8;
  uint64_t uStack_b0;
  TermList local_a8;
  uint64_t uStack_a0;
  TermSpec local_98;
  TermSpec local_88;
  uint64_t local_78;
  undefined8 uStack_70;
  uint64_t local_68;
  undefined8 uStack_60;
  TermSpec local_50;
  TermSpec local_40;
  
  local_50.term = t.term._content;
  local_40.term = s.term._content;
  local_40.index = s.index;
  local_50.index = t.index;
  bVar8 = TermSpec::sameTermContent(&local_40,&local_50);
  bVar14 = true;
  if (!bVar8) {
    local_1a0._boList = (BacktrackObject *)0x0;
    if ((this->super_Backtrackable)._bdStack._cursor == (this->super_Backtrackable)._bdStack._end) {
      ::Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)this);
    }
    *(this->super_Backtrackable)._bdStack._cursor = &local_1a0;
    pppBVar1 = &(this->super_Backtrackable)._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + 1;
    if ((unify(Kernel::TermSpec,Kernel::TermSpec)::toDo == '\0') &&
       (iVar10 = __cxa_guard_acquire(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo), iVar10 != 0))
    {
      unify::toDo._capacity = 0x40;
      unify::toDo._stack = (pair<Kernel::TermSpec,_Kernel::TermSpec> *)::operator_new(0x800,0x10);
      unify::toDo._end = unify::toDo._stack + unify::toDo._capacity;
      unify::toDo._cursor = unify::toDo._stack;
      __cxa_atexit(::Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::~Stack,&unify::toDo
                   ,&__dso_handle);
      __cxa_guard_release(&unify(Kernel::TermSpec,Kernel::TermSpec)::toDo);
    }
    uStack_70 = CONCAT44(local_40._12_4_,local_40.index);
    local_78 = local_40.term._content;
    uStack_60 = CONCAT44(local_50._12_4_,local_50.index);
    local_68 = local_50.term._content;
    if (unify::toDo._cursor == unify::toDo._end) {
      ::Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand(&unify::toDo);
    }
    ppVar6 = unify::toDo._cursor;
    ((unify::toDo._cursor)->second).term._content = local_68;
    *(undefined8 *)&(ppVar6->second).index = uStack_60;
    (ppVar6->first).term._content = local_78;
    *(undefined8 *)&(ppVar6->first).index = uStack_70;
    unify::toDo._cursor = unify::toDo._cursor + 1;
    if (unify(Kernel::TermSpec,Kernel::TermSpec)::encountered_ == '\0') {
      unify();
    }
    ::Lib::
    DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::reset(&unify::encountered_._map);
    local_120 = &this->_bindings;
    bVar14 = false;
    do {
      if (unify::toDo._cursor == unify::toDo._stack) break;
      local_98.term._content = unify::toDo._cursor[-1].first.term._content;
      local_98.index = unify::toDo._cursor[-1].first.index;
      local_98._12_4_ = *(undefined4 *)&unify::toDo._cursor[-1].first.field_0xc;
      local_88.term._content = unify::toDo._cursor[-1].second.term._content;
      local_88.index = unify::toDo._cursor[-1].second.index;
      local_88._12_4_ = *(undefined4 *)&unify::toDo._cursor[-1].second.field_0xc;
      unify::toDo._cursor = unify::toDo._cursor + -1;
      pTVar11 = derefBound(this,&local_98);
      local_188.term._content = (pTVar11->term)._content;
      local_188.index = pTVar11->index;
      local_188._12_4_ = *(undefined4 *)&pTVar11->field_0xc;
      pTVar11 = derefBound(this,&local_88);
      local_198.term._content = (pTVar11->term)._content;
      local_198.index = pTVar11->index;
      local_198._12_4_ = *(undefined4 *)&pTVar11->field_0xc;
      bVar9 = TermSpec::sameTermContent(&local_188,&local_198);
      bVar8 = true;
      if (!bVar9) {
        if ((local_188.term._content & 1) == 0) {
LAB_005c1739:
          if ((local_198.term._content & 1) != 0) {
            local_150._iter._func.other._iter._func.this = (TermSpec *)local_198.term._content;
            local_150._iter._func.other._iter._inner._next = local_198.index;
            bVar9 = occurs(this,(VarSpec *)&local_150,&local_188);
            if (!bVar9) {
              local_150._iter._func.other._iter._func.this = (TermSpec *)local_198.term._content;
              local_150._iter._func.other._iter._inner._next = local_198.index;
              TVar13._content = local_188.term._content;
              iVar10 = local_188.index;
              goto LAB_005c19cc;
            }
          }
          if ((((local_188.term._content & 3) == 0) && ((local_198.term._content & 3) == 0)) &&
             (*(int *)(local_188.term._content + 8) == *(int *)(local_198.term._content + 8))) {
            local_150._iter._inner._inner._to = *(uint *)(local_188.term._content + 0xc) & 0xfffffff
            ;
            local_150._iter._func.other._iter._inner._to =
                 *(uint *)(local_198.term._content + 0xc) & 0xfffffff;
            local_150._iter._func.other._iter._inner._next = 0;
            local_150._iter._func.other._iter._inner._from = 0;
            local_150._iter._inner._inner._next = 0;
            local_150._iter._inner._inner._from = 0;
            local_e8 = &local_150;
            local_150._iter._func.other._iter._func.this = &local_198;
            local_150._iter._inner._func.this = &local_188;
            ::Lib::
            IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
            ::tryNext(&local_e0,local_e8);
            if (local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._isSome ==
                true) {
              do {
                local_b8._content =
                     (uint64_t)
                     local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem.init.first.term._content;
                uStack_b0 = local_e0.
                            super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                            _elem._8_8_;
                local_a8._content =
                     (uint64_t)
                     local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem.init.second.term._content;
                uStack_a0 = local_e0.
                            super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                            _elem._24_8_;
                local_178._0_8_ =
                     local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem.init.first.term._content;
                local_178._8_8_ =
                     local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem._8_8_;
                uVar7 = local_178._8_8_;
                local_168._content =
                     (uint64_t)
                     local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem.init.second.term._content;
                TStack_160._content =
                     local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                     ._elem._24_8_;
                if (((ulong)local_e0.
                            super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                            _elem.init.first.term._content & 1) == 0) {
LAB_005c18a0:
                  pEVar12 = ::Lib::
                            DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                            ::findEntry(&unify::encountered_._map,
                                        (pair<Kernel::TermSpec,_Kernel::TermSpec> *)local_178);
                  if (pEVar12 == (Entry *)0x0) {
                    ::Lib::
                    DHMap<std::pair<Kernel::TermSpec,_Kernel::TermSpec>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                    ::insert(&unify::encountered_._map);
                    local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                    ._elem._8_8_ = local_168._content;
                    local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                    ._elem.init.second.term._content = (TermList)(TermList)TStack_160._content;
                    local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._0_8_
                         = local_178._0_8_;
                    local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem
                    ._elem.init.first.term._content = (TermList)(TermList)local_178._8_8_;
                    if (unify::toDo._cursor == unify::toDo._end) {
                      ::Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand
                                (&unify::toDo);
                    }
                    goto LAB_005c190b;
                  }
                }
                else {
                  local_178._8_4_ =
                       (undefined4)
                       local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem._8_8_;
                  v.index = local_178._8_4_;
                  v._self._content =
                       (uint64_t)
                       local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem.init.first.term._content;
                  v._12_4_ = 0;
                  local_178._8_8_ = uVar7;
                  bVar8 = isUnbound(this,v);
                  if ((!bVar8) || ((local_168._content & 1) == 0)) goto LAB_005c18a0;
                  v_00.index = (int)TStack_160._content;
                  v_00._self._content = local_168._content;
                  v_00._12_4_ = 0;
                  bVar8 = isUnbound(this,v_00);
                  if (!bVar8) goto LAB_005c18a0;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem._8_8_ = local_168._content;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem.init.second.term._content = (TermList)(TermList)TStack_160._content;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._0_8_ =
                       local_178._0_8_;
                  local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem.init.first.term._content = (TermList)(TermList)local_178._8_8_;
                  if (unify::toDo._cursor == unify::toDo._end) {
                    ::Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>::expand
                              (&unify::toDo);
                  }
LAB_005c190b:
                  ppVar6 = unify::toDo._cursor;
                  ((unify::toDo._cursor)->second).term._content =
                       local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem._8_8_;
                  *(TermList *)&(ppVar6->second).index =
                       local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem.init.second.term._content;
                  (ppVar6->first).term._content =
                       local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _0_8_;
                  *(TermList *)&(ppVar6->first).index =
                       local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem.init.first.term._content;
                  unify::toDo._cursor = unify::toDo._cursor + 1;
                }
                ::Lib::
                IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/RobSubstitution.hpp:120:59),_Kernel::TermSpec>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1678:16),_std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>_>
                ::tryNext(&local_118,local_e8);
                local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._isSome =
                     local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                     _isSome;
                if (local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                    _isSome == true) {
                  local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem.init.second.term._content =
                       local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem.init.second.term._content;
                  local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem._24_8_ = local_118.
                                 super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                                 _elem._elem._24_8_;
                  local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem.init.first.term._content =
                       local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _elem._elem.init.first.term._content;
                  local_e0.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>._elem.
                  _elem._8_8_ = local_118.
                                super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                                _elem._elem._8_8_;
                }
              } while (local_118.super_OptionBase<std::pair<Kernel::TermSpec,_Kernel::TermSpec>_>.
                       _isSome != false);
            }
            bVar8 = true;
          }
          else {
            bVar8 = false;
            bVar14 = true;
          }
        }
        else {
          local_150._iter._func.other._iter._func.this = (TermSpec *)local_188.term._content;
          local_150._iter._func.other._iter._inner._next = local_188.index;
          bVar9 = occurs(this,(VarSpec *)&local_150,&local_198);
          if (bVar9) goto LAB_005c1739;
          local_150._iter._func.other._iter._func.this = (TermSpec *)local_188.term._content;
          local_150._iter._func.other._iter._inner._next = local_188.index;
          TVar13._content = local_198.term._content;
          iVar10 = local_198.index;
LAB_005c19cc:
          b.index = iVar10;
          b.term._content = TVar13._content;
          b._12_4_ = 0;
          bind<Kernel::TermSpec,Lib::DefaultHash,Lib::DefaultHash2>
                    (this,local_120,(VarSpec *)&local_150,b);
        }
      }
    } while (bVar8);
    if (bVar14) {
      unify::toDo._cursor = unify::toDo._stack;
      pppBVar1 = &(this->super_Backtrackable)._bdStack._cursor;
      *pppBVar1 = *pppBVar1 + -1;
      BVar5._boList = local_1a0._boList;
      while (BVar5._boList != (BacktrackObject *)0x0) {
        (*(BVar5._boList)->_vptr_BacktrackObject[2])(BVar5._boList);
        pBVar3 = (BVar5._boList)->_next;
        (*(BVar5._boList)->_vptr_BacktrackObject[1])(BVar5._boList);
        BVar5._boList = pBVar3;
      }
    }
    else {
      ppBVar4 = (this->super_Backtrackable)._bdStack._cursor;
      ppBVar2 = ppBVar4 + -1;
      (this->super_Backtrackable)._bdStack._cursor = ppBVar2;
      BVar5._boList = local_1a0._boList;
      if ((ppBVar2 != (this->super_Backtrackable)._bdStack._stack) &&
         (ppBVar4[-2] != (BacktrackData *)0x0)) {
        ::Lib::Backtrackable::bdCommit(&this->super_Backtrackable,&local_1a0);
        BVar5._boList = local_1a0._boList;
      }
      while (BVar5._boList != (BacktrackObject *)0x0) {
        pBVar3 = (BVar5._boList)->_next;
        (*(BVar5._boList)->_vptr_BacktrackObject[1])();
        BVar5._boList = pBVar3;
      }
    }
    bVar14 = (bool)(bVar14 ^ 1);
  }
  return bVar14;
}

Assistant:

bool RobSubstitution::unify(TermSpec s, TermSpec t)
{
#define DEBUG_UNIFY(lvl, ...) if (lvl < 0) DBG("unify: ", __VA_ARGS__)
  DEBUG_UNIFY(0, *this, ".unify(", s, ",", t, ")")


  if(s.sameTermContent(t)) {
    return true;
  }

  BacktrackData localBD;
  bdRecord(localBD);

  static Stack<pair<TermSpec, TermSpec>> toDo(64);
  ASS(toDo.isEmpty());
  toDo.push(make_pair(std::move(s), std::move(t)));

  // Save encountered unification pairs to avoid
  // recomputing their unification
  static DHSet<pair<TermSpec, TermSpec>> encountered_;
  auto encountered = &encountered_;
  encountered->reset();
  

  auto pushTodo = [&](auto pair) {
      // we unify each subterm pair at most once, to avoid worst-case exponential runtimes
      // in order to safe memory we do ot do this for variables.
      // (Note by joe:  didn't make this decision, but just keeping the implemenntation 
      // working as before. i.e. as described in the paper "Comparing Unification 
      // Algorithms in First-Order Theorem Proving", by Krystof and Andrei)
      if (pair.first.isVar() && isUnbound(pair.first.varSpec()) &&
          pair.second.isVar() && isUnbound(pair.second.varSpec())) {
        toDo.push(std::move(pair));
      } else if (!encountered->find(pair)) {
        encountered->insert(pair);
        toDo.push(std::move(pair));
      }
  };

  bool mismatch=false;
  // Iteratively resolve unification pairs in toDo
  // the current pair is always in t1 and t2 with their dereferenced
  // version in dt1 and dt2
  while (toDo.isNonEmpty()) {
    auto x = toDo.pop();
    TermSpec dt1 = derefBound(x.first);
    TermSpec dt2 = derefBound(x.second);
    DEBUG_UNIFY(1, "next pair: ", tie(dt1, dt2))
    // If they have the same content then skip
    // (note that sameTermContent is best-effort)
    if (dt1.sameTermContent(dt2)) {
    // Deal with the case where eithe rare variables
    // Do an occurs-check and note that the variable 
    // cannot be currently bound as we already dereferenced
    } else if(dt1.isVar() && !occurs(dt1.varSpec(), dt2)) {
      bind(dt1.varSpec(), dt2);

    } else if(dt2.isVar() && !occurs(dt2.varSpec(), dt1)) {
      bind(dt2.varSpec(), dt1);

    } else if(dt1.isTerm() && dt2.isTerm() 
           && dt1.functor() == dt2.functor()) {

      for (auto c : dt1.allArgs().zip(dt2.allArgs())) {
        pushTodo(make_pair(std::move(c.first), std::move(c.second)));
      }

    } else {
      mismatch = true;
      break;
    }

    ASS(!mismatch)
  }

  if(mismatch) {
    toDo.reset();
  }

  bdDone();

  if(mismatch) {
    localBD.backtrack();
  } else {
    if(bdIsRecording()) {
      bdCommit(localBD);
    }
    localBD.drop();
  }

  DEBUG_UNIFY(0, *this)
  return !mismatch;
}